

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O0

CURLcode cf_he_insert_after(Curl_cfilter *cf_at,Curl_easy *data,Curl_dns_entry *remotehost,
                           int transport)

{
  Curl_cfilter *pCStack_40;
  CURLcode result;
  Curl_cfilter *cf;
  cf_ip_connect_create *cf_create;
  Curl_dns_entry *pCStack_28;
  int transport_local;
  Curl_dns_entry *remotehost_local;
  Curl_easy *data_local;
  Curl_cfilter *cf_at_local;
  
  cf_create._4_4_ = transport;
  pCStack_28 = remotehost;
  remotehost_local = (Curl_dns_entry *)data;
  data_local = (Curl_easy *)cf_at;
  cf = (Curl_cfilter *)get_cf_create(transport);
  if (cf == (Curl_cfilter *)0x0) {
    if ((((remotehost_local != (Curl_dns_entry *)0x0) &&
         ((*(ulong *)((long)&remotehost_local[0x54].hostport + 2) >> 0x1c & 1) != 0)) &&
        ((remotehost_local[0x99].timestamp == 0 ||
         (0 < *(int *)(remotehost_local[0x99].timestamp + 8))))) &&
       ((data_local != (Curl_easy *)0x0 && (0 < *(int *)(*(long *)data_local + 0xc))))) {
      Curl_trc_cf_infof((Curl_easy *)remotehost_local,(Curl_cfilter *)data_local,
                        "unsupported transport type %d",(ulong)cf_create._4_4_);
    }
    cf_at_local._4_4_ = CURLE_UNSUPPORTED_PROTOCOL;
  }
  else {
    cf_at_local._4_4_ =
         cf_happy_eyeballs_create
                   (&stack0xffffffffffffffc0,(Curl_easy *)remotehost_local,data_local->conn,
                    (cf_ip_connect_create *)cf,pCStack_28,cf_create._4_4_);
    if (cf_at_local._4_4_ == CURLE_OK) {
      Curl_conn_cf_insert_after((Curl_cfilter *)data_local,pCStack_40);
      cf_at_local._4_4_ = CURLE_OK;
    }
  }
  return cf_at_local._4_4_;
}

Assistant:

static CURLcode cf_he_insert_after(struct Curl_cfilter *cf_at,
                                   struct Curl_easy *data,
                                   const struct Curl_dns_entry *remotehost,
                                   int transport)
{
  cf_ip_connect_create *cf_create;
  struct Curl_cfilter *cf;
  CURLcode result;

  /* Need to be first */
  DEBUGASSERT(cf_at);
  cf_create = get_cf_create(transport);
  if(!cf_create) {
    CURL_TRC_CF(data, cf_at, "unsupported transport type %d", transport);
    return CURLE_UNSUPPORTED_PROTOCOL;
  }
  result = cf_happy_eyeballs_create(&cf, data, cf_at->conn,
                                    cf_create, remotehost,
                                    transport);
  if(result)
    return result;

  Curl_conn_cf_insert_after(cf_at, cf);
  return CURLE_OK;
}